

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptorProto::Swap
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *other)

{
  int32 iVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  EnumValueOptions *pEVar5;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar6;
  
  if (other != this) {
    psVar4 = this->name_;
    this->name_ = other->name_;
    other->name_ = psVar4;
    iVar1 = this->number_;
    this->number_ = other->number_;
    other->number_ = iVar1;
    pEVar5 = this->options_;
    this->options_ = other->options_;
    other->options_ = pEVar5;
    uVar2 = this->_has_bits_[0];
    this->_has_bits_[0] = other->_has_bits_[0];
    other->_has_bits_[0] = uVar2;
    pvVar6 = (this->_unknown_fields_).fields_;
    (this->_unknown_fields_).fields_ = (other->_unknown_fields_).fields_;
    (other->_unknown_fields_).fields_ = pvVar6;
    iVar3 = this->_cached_size_;
    this->_cached_size_ = other->_cached_size_;
    other->_cached_size_ = iVar3;
  }
  return;
}

Assistant:

void EnumValueDescriptorProto::Swap(EnumValueDescriptorProto* other) {
  if (other != this) {
    std::swap(name_, other->name_);
    std::swap(number_, other->number_);
    std::swap(options_, other->options_);
    std::swap(_has_bits_[0], other->_has_bits_[0]);
    _unknown_fields_.Swap(&other->_unknown_fields_);
    std::swap(_cached_size_, other->_cached_size_);
  }
}